

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O1

void anon_unknown.dwarf_4a82::GetWindowedWaveform
               (double *x,int x_length,int fs,double current_f0,double current_position,
               int window_type,double window_length_ratio,double *waveform,RandnState *randn_state)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar12 = (double)fs;
  uVar2 = matlab_round(((dVar12 * window_length_ratio) / current_f0) * 0.5);
  uVar1 = uVar2 * 2;
  lVar9 = (long)(int)(uVar2 * 2 + 1);
  uVar11 = lVar9 * 4;
  uVar10 = lVar9 << 3;
  if ((int)uVar2 < 0) {
    uVar11 = 0xffffffffffffffff;
    uVar10 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar11);
  pvVar5 = operator_new__(uVar11);
  pvVar6 = operator_new__(uVar10);
  if (-1 < (int)uVar2) {
    lVar9 = 0;
    do {
      *(uint *)((long)pvVar4 + lVar9 * 4 + (ulong)uVar2 * 4 + (long)(int)uVar2 * -4) =
           (int)lVar9 - uVar2;
      lVar9 = lVar9 + 1;
    } while (uVar1 + 1 != (int)lVar9);
  }
  iVar3 = matlab_round(current_position * dVar12 + 0.001);
  if (-1 < (int)uVar2) {
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = uVar1;
    }
    uVar11 = 0;
    do {
      iVar8 = *(int *)((long)pvVar4 + uVar11 * 4) + iVar3;
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      if (x_length + -1 < iVar8) {
        iVar8 = x_length + -1;
      }
      *(int *)((long)pvVar5 + uVar11 * 4) = iVar8;
      uVar11 = uVar11 + 1;
    } while ((uVar7 | 1) != uVar11);
  }
  if (window_type == 1) {
    if (-1 < (int)uVar2) {
      uVar11 = 0;
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = uVar1;
      }
      do {
        dVar13 = (double)*(int *)((long)pvVar4 + uVar11 * 4);
        dVar13 = cos((((dVar13 + dVar13) / window_length_ratio) / dVar12) * 3.141592653589793 *
                     current_f0);
        *(double *)((long)pvVar6 + uVar11 * 8) = dVar13 * 0.5 + 0.5;
        uVar11 = uVar11 + 1;
      } while ((uVar2 | 1) != uVar11);
    }
  }
  else if (-1 < (int)uVar2) {
    uVar11 = 0;
    uVar2 = 0;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    do {
      dVar13 = (double)*(int *)((long)pvVar4 + uVar11 * 4);
      dVar13 = (((dVar13 + dVar13) / window_length_ratio) / dVar12) * 3.141592653589793 * current_f0
      ;
      dVar14 = cos(dVar13);
      dVar13 = cos(dVar13 + dVar13);
      *(double *)((long)pvVar6 + uVar11 * 8) = dVar13 * 0.08 + dVar14 * 0.5 + 0.42;
      uVar11 = uVar11 + 1;
    } while ((uVar2 | 1) != uVar11);
  }
  if (-1 < (int)uVar1) {
    lVar9 = 0;
    do {
      dVar12 = x[*(int *)((long)pvVar5 + lVar9 * 4)];
      dVar13 = *(double *)((long)pvVar6 + lVar9 * 8);
      dVar14 = randn(randn_state);
      waveform[lVar9] = dVar14 * 1e-06 + dVar12 * dVar13;
      lVar9 = lVar9 + 1;
    } while ((ulong)uVar1 + 1 != lVar9);
  }
  if ((int)uVar1 < 0) {
    dVar12 = NAN;
  }
  else {
    dVar13 = 0.0;
    uVar11 = 0;
    dVar12 = 0.0;
    do {
      dVar12 = dVar12 + waveform[uVar11];
      dVar13 = dVar13 + *(double *)((long)pvVar6 + uVar11 * 8);
      uVar11 = uVar11 + 1;
    } while ((uVar1 | 1) != uVar11);
    dVar12 = dVar12 / dVar13;
  }
  if (-1 < (int)uVar1) {
    uVar11 = 0;
    do {
      waveform[uVar11] = waveform[uVar11] - *(double *)((long)pvVar6 + uVar11 * 8) * dVar12;
      uVar11 = uVar11 + 1;
    } while ((uVar1 | 1) != uVar11);
  }
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  operator_delete__(pvVar6);
  return;
}

Assistant:

static void GetWindowedWaveform(const double *x, int x_length, int fs,
    double current_f0, double current_position, int window_type,
    double window_length_ratio, double *waveform, RandnState *randn_state) {
  int half_window_length =
    matlab_round(window_length_ratio * fs / current_f0 / 2.0);

  int *base_index = new int[half_window_length * 2 + 1];
  int *safe_index = new int[half_window_length * 2 + 1];
  double *window  = new double[half_window_length * 2 + 1];

  SetParametersForGetWindowedWaveform(half_window_length, x_length,
      current_position, fs, current_f0, window_type, window_length_ratio,
      base_index, safe_index, window);

  // F0-adaptive windowing
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] =
      x[safe_index[i]] * window[i] + randn(randn_state) * world::kSafeGuardD4C;

  double tmp_weight1 = 0;
  double tmp_weight2 = 0;
  for (int i = 0; i <= half_window_length * 2; ++i) {
    tmp_weight1 += waveform[i];
    tmp_weight2 += window[i];
  }
  double weighting_coefficient = tmp_weight1 / tmp_weight2;
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] -= window[i] * weighting_coefficient;

  delete[] base_index;
  delete[] safe_index;
  delete[] window;
}